

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

ConstString * __thiscall Clasp::ConstString::operator=(ConstString *this,ConstString *rhs)

{
  int *piVar1;
  uint64 ref;
  RefCount *p;
  
  piVar1 = (int *)rhs->ref_;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  ref = this->ref_;
  this->ref_ = (RefType)piVar1;
  StrRef::release(ref);
  return this;
}

Assistant:

ConstString& ConstString::operator=(const ConstString& rhs) {
	ConstString temp(rhs);
	swap(temp);
	return *this;
}